

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::AssertionResult::getExpressionInMacro_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResult *this)

{
  bool bVar1;
  size_type sVar2;
  StringRef rhs;
  StringRef rhs_00;
  AssertionResult *this_local;
  string *expr;
  
  bVar1 = StringRef::empty((StringRef *)this);
  if (bVar1) {
    StringRef::operator_cast_to_string(__return_storage_ptr__,&(this->m_info).capturedExpression);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    StringRef::size((StringRef *)this);
    sVar2 = StringRef::size(&(this->m_info).capturedExpression);
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    rhs.m_size = sVar2;
    rhs.m_start = (char *)(this->m_info).macroName.m_size;
    Catch::operator+=((Catch *)__return_storage_ptr__,(string *)(this->m_info).macroName.m_start,rhs
                     );
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"( ");
    rhs_00.m_size = sVar2;
    rhs_00.m_start = (char *)(this->m_info).capturedExpression.m_size;
    Catch::operator+=((Catch *)__return_storage_ptr__,
                      (string *)(this->m_info).capturedExpression.m_start,rhs_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," )");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResult::getExpressionInMacro() const {
        if ( m_info.macroName.empty() ) {
            return static_cast<std::string>( m_info.capturedExpression );
        }
        std::string expr;
        expr.reserve( m_info.macroName.size() + m_info.capturedExpression.size() + 4 );
        expr += m_info.macroName;
        expr += "( ";
        expr += m_info.capturedExpression;
        expr += " )";
        return expr;
    }